

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::ReadableDirectory::Entry>::truncate
          (ArrayBuilder<kj::ReadableDirectory::Entry> *this,char *__file,__off_t __length)

{
  Entry *pEVar1;
  char *pcVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  
  pEVar1 = this->ptr;
  pEVar6 = this->pos;
  while (pEVar5 = pEVar6, pEVar1 + (long)__file < pEVar5) {
    this->pos = pEVar5 + -1;
    pcVar2 = pEVar5[-1].name.content.ptr;
    pEVar6 = pEVar5 + -1;
    if (pcVar2 != (char *)0x0) {
      sVar3 = pEVar5[-1].name.content.size_;
      pEVar5[-1].name.content.ptr = (char *)0x0;
      pEVar5[-1].name.content.size_ = 0;
      pAVar4 = pEVar5[-1].name.content.disposer;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar2,1,sVar3,sVar3,0);
      pEVar6 = this->pos;
    }
  }
  return (int)pEVar5;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }